

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O1

PAL_ERROR CorUnix::InternalReadFile
                    (CPalThread *pThread,HANDLE hFile,LPVOID lpBuffer,DWORD nNumberOfBytesToRead,
                    LPDWORD lpNumberOfBytesRead,LPOVERLAPPED lpOverlapped)

{
  int iUnixFd;
  PAL_ERROR PVar1;
  ssize_t sVar2;
  int *piVar3;
  undefined8 *local_60;
  IFileTransactionLock *pTransactionLock;
  IPalObject *pFileObject;
  CFileProcessLocalData *pLocalData;
  IDataLock *pLocalDataLock;
  LONG local_38;
  LONG readOffsetStartLow;
  LONG readOffsetStartHigh;
  
  pTransactionLock = (IFileTransactionLock *)0x0;
  pFileObject = (IPalObject *)0x0;
  pLocalData = (CFileProcessLocalData *)0x0;
  local_60 = (undefined8 *)0x0;
  pLocalDataLock._4_4_ = 0;
  local_38 = 0;
  if (lpNumberOfBytesRead == (LPDWORD)0x0) {
    PVar1 = 0x57;
  }
  else {
    *lpNumberOfBytesRead = 0;
    if ((undefined1 *)hFile == &DAT_ffffffffffffffff) {
      PVar1 = 6;
    }
    else {
      if (lpOverlapped != (LPOVERLAPPED)0x0) {
        fprintf(_stderr,"] %s %s:%d","InternalReadFile",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0x8f0);
        fprintf(_stderr,"lpOverlapped is not NULL, as it should be.\n");
        PVar1 = 0x57;
        goto LAB_0032cae8;
      }
      if (lpBuffer == (LPVOID)0x0) {
        PVar1 = 0x3e6;
      }
      else {
        PVar1 = (**(code **)(*g_pObjectManager + 0x28))
                          (g_pObjectManager,pThread,hFile,aotFile,0x80000000,&pTransactionLock);
        if ((PVar1 != 0) ||
           (PVar1 = (*pTransactionLock->_vptr_IFileTransactionLock[3])
                              (pTransactionLock,pThread,0,&pLocalData,&pFileObject), PVar1 != 0))
        goto LAB_0032cae8;
        if (*(int *)((long)&pFileObject[2]._vptr_IPalObject + 4) != 1) {
          iUnixFd = *(int *)&pFileObject[1]._vptr_IPalObject;
          if (pFileObject->_vptr_IPalObject != (_func_int **)0x0) {
            PVar1 = InternalSetFilePointerForUnixFd
                              (iUnixFd,0,&local_38,1,(PLONG)((long)&pLocalDataLock + 4));
            if (PVar1 != 0) {
              fprintf(_stderr,"] %s %s:%d","InternalReadFile",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                      ,0x92f);
              fprintf(_stderr,"Failed to get the current file position\n");
              PVar1 = 0x54f;
              goto LAB_0032cae8;
            }
            readOffsetStartLow = iUnixFd;
            PVar1 = (**(code **)*pFileObject->_vptr_IPalObject)
                              (pFileObject->_vptr_IPalObject,pThread,0,pLocalDataLock._4_4_,local_38
                               ,nNumberOfBytesToRead,0,&local_60);
            iUnixFd = readOffsetStartLow;
            if (PVar1 != 0) goto LAB_0032cadf;
          }
          readOffsetStartLow = iUnixFd;
          (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,pThread,0);
          pLocalData = (CFileProcessLocalData *)0x0;
          pFileObject = (IPalObject *)0x0;
          do {
            if ((PAL_InitializeChakraCoreCalled == false) ||
               (sVar2 = read(readOffsetStartLow,lpBuffer,(ulong)nNumberOfBytesToRead),
               PAL_InitializeChakraCoreCalled == false)) goto LAB_0032cccc;
            if (-1 < (int)(DWORD)sVar2) {
              *lpNumberOfBytesRead = (DWORD)sVar2;
              goto LAB_0032cae8;
            }
            piVar3 = __errno_location();
          } while (*piVar3 == 4);
          PVar1 = FILEGetLastErrorFromErrno();
          goto LAB_0032cae8;
        }
        PVar1 = 5;
      }
    }
  }
LAB_0032cadf:
  if (PAL_InitializeChakraCoreCalled == false) {
LAB_0032cccc:
    abort();
  }
LAB_0032cae8:
  if (local_60 != (undefined8 *)0x0) {
    (**(code **)*local_60)();
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,pThread,0);
  }
  if (pTransactionLock != (IFileTransactionLock *)0x0) {
    (*pTransactionLock->_vptr_IFileTransactionLock[8])(pTransactionLock,pThread);
  }
  return PVar1;
}

Assistant:

PAL_ERROR
CorUnix::InternalReadFile(
    CPalThread *pThread,
    HANDLE hFile,
    LPVOID lpBuffer,
    DWORD nNumberOfBytesToRead,
    LPDWORD lpNumberOfBytesRead,
    LPOVERLAPPED lpOverlapped
    )
{
    PAL_ERROR palError = 0;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;
    IFileTransactionLock *pTransactionLock = NULL;
    int ifd;
    
    LONG readOffsetStartLow = 0, readOffsetStartHigh = 0;
    int res;

    if (NULL != lpNumberOfBytesRead)
    {
        //
        // This must be set to 0 before any other error checking takes
        // place, per MSDN
        //

        *lpNumberOfBytesRead = 0;        
    }
    else
    {
        ERROR( "lpNumberOfBytesRead is NULL\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto done;
    }
    else if (NULL != lpOverlapped)
    {
        ASSERT( "lpOverlapped is not NULL, as it should be.\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }
    else if (NULL == lpBuffer)
    {
        ERROR( "Invalid parameter. (lpBuffer:%p)\n", lpBuffer);
        palError = ERROR_NOACCESS;
        goto done;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    if (pLocalData->open_flags_deviceaccessonly == TRUE)
    {
        ERROR("File open for device access only\n");
        palError = ERROR_ACCESS_DENIED;
        goto done;
    }

    ifd = pLocalData->unix_fd;

    //
    // Inform the lock controller for this file (if any) of our intention
    // to perform a read. (Note that pipes don't have lock controllers.)
    //
    
    if (NULL != pLocalData->pLockController)
    {
        /* Get the current file position to calculate the region to lock */
        palError = InternalSetFilePointerForUnixFd(
            ifd,
            0,
            &readOffsetStartHigh,
            FILE_CURRENT,
            &readOffsetStartLow
            );

        if (NO_ERROR != palError)
        {
            ASSERT("Failed to get the current file position\n");
            palError = ERROR_INTERNAL_ERROR;
            goto done;
        }

        palError = pLocalData->pLockController->GetTransactionLock(
            pThread,
            IFileLockController::ReadLock,
            readOffsetStartLow,
            readOffsetStartHigh,
            nNumberOfBytesToRead,
            0,
            &pTransactionLock
            );

        if (NO_ERROR != palError)
        {
            ERROR("Unable to obtain read transaction lock");
            goto done;
        }
    }

    //
    // Release the data lock before performing the (possibly blocking)
    // read call
    //

    pLocalDataLock->ReleaseLock(pThread, FALSE);
    pLocalDataLock = NULL;
    pLocalData = NULL;

Read:
    TRACE("Reading from file descriptor %d\n", ifd);
    res = read(ifd, lpBuffer, nNumberOfBytesToRead);
    TRACE("read() returns %d\n", res);

    if (res >= 0)
    {
        *lpNumberOfBytesRead = res;
    }
    else if (errno == EINTR)
    {
        // Try to read again.
        goto Read;
    }
    else
    {
        palError = FILEGetLastErrorFromErrno();
    }
    
done:

    if (NULL != pTransactionLock)
    {
        pTransactionLock->ReleaseLock();
    }

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}